

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VectorIO.cpp
# Opt level: O0

void amrex::writeIntData(int *data,size_t size,ostream *os,IntDescriptor *id)

{
  bool bVar1;
  int iVar2;
  IntDescriptor *id_00;
  IntDescriptor *in_RCX;
  ostream *in_RDX;
  IntDescriptor *in_RSI;
  ostream *in_RDI;
  int *unaff_retaddr;
  IntDescriptor *this;
  size_t in_stack_fffffffffffffff8;
  
  this = in_RCX;
  id_00 = FPC::NativeIntDescriptor();
  bVar1 = IntDescriptor::operator==(in_RCX,id_00);
  if (bVar1) {
    std::ostream::write((char *)in_RDX,(long)in_RDI);
  }
  else {
    iVar2 = IntDescriptor::numBytes(this);
    if (iVar2 == 2) {
      writeIntData<short,int>((int *)in_RDI,(size_t)in_RSI,in_RDX,this);
    }
    else {
      iVar2 = IntDescriptor::numBytes(this);
      if (iVar2 == 4) {
        writeIntData<int,int>((int *)in_RDI,(size_t)in_RSI,in_RDX,this);
      }
      else {
        iVar2 = IntDescriptor::numBytes(this);
        if (iVar2 == 8) {
          writeIntData<long,int>(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,in_RSI);
        }
        else {
          Error_host((char *)in_RDX);
        }
      }
    }
  }
  return;
}

Assistant:

void amrex::writeIntData (const int* data, std::size_t size, std::ostream& os,
                          const IntDescriptor& id)
{
    if (id == FPC::NativeIntDescriptor())
    {
        os.write((char*) data, size*sizeof(int));
    }
    else if (id.numBytes() == 2)
    {
        writeIntData<std::int16_t, int>(data, size, os, id);
    }
    else if (id.numBytes() == 4)
    {
        writeIntData<std::int32_t, int>(data, size, os, id);
    }
    else if (id.numBytes() == 8)
    {
        writeIntData<std::int64_t, int>(data, size, os, id);
    }
    else {
        amrex::Error("Don't know how to work with this integer type.");
    }
}